

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O2

string * __thiscall Search::construct_path_abi_cxx11_(string *__return_storage_ptr__,Search *this)

{
  pointer pcVar1;
  shared_ptr<Node> p;
  shared_ptr<Node> parent;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&p.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>,
             &(this->final).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>);
  while (((p.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->parent).
         super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&parent.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)
               p.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&parent.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&p.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)
               p.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string Search::construct_path() {
    string path;
    for (auto p = final; p->parent != nullptr; p = p->parent) {
        auto parent = p->parent;
        int delta_x = p->x - parent->x;
        int delta_y = p->y - parent->y;
        if (delta_x == 0 and delta_y == 1) path.push_back('R');
        else if (delta_x == 0 and delta_y == -1) path.push_back('L');
        else if (delta_x == 1 and delta_y == 0) path.push_back('D');
        else path.push_back('U');
    }
    reverse(path.begin(), path.end());
    return path;
}